

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

string * __thiscall
HighsMipSolverData::solutionSourceToString_abi_cxx11_
          (string *__return_storage_ptr__,HighsMipSolverData *this,int solution_source,bool code)

{
  char *pcVar1;
  allocator local_11;
  
  switch(solution_source) {
  case 0:
    if (code) {
      pcVar1 = "B";
    }
    else {
      pcVar1 = "Branching";
    }
    break;
  case 1:
    if (code) {
      pcVar1 = "C";
    }
    else {
      pcVar1 = "Central rounding";
    }
    break;
  case 2:
    if (code) {
      pcVar1 = "F";
    }
    else {
      pcVar1 = "Feasibility pump";
    }
    break;
  case 3:
    if (code) {
      pcVar1 = "H";
    }
    else {
      pcVar1 = "Heuristic";
    }
    break;
  case 4:
    if (code) {
      pcVar1 = "L";
    }
    else {
      pcVar1 = "Sub-MIP";
    }
    break;
  case 5:
    if (code) {
      pcVar1 = "P";
    }
    else {
      pcVar1 = "Empty MIP";
    }
    break;
  case 6:
    if (code) {
      pcVar1 = "R";
    }
    else {
      pcVar1 = "Randomized rounding";
    }
    break;
  case 7:
    if (code) {
      pcVar1 = "S";
    }
    else {
      pcVar1 = "Solve LP";
    }
    break;
  case 8:
    if (code) {
      pcVar1 = "T";
    }
    else {
      pcVar1 = "Evaluate node";
    }
    break;
  case 9:
    if (code) {
      pcVar1 = "U";
    }
    else {
      pcVar1 = "Unbounded";
    }
    break;
  case 10:
    if (code) {
      pcVar1 = "z";
    }
    else {
      pcVar1 = "Trivial zero";
    }
    break;
  case 0xb:
    if (code) {
      pcVar1 = "l";
    }
    else {
      pcVar1 = "Trivial lower";
    }
    break;
  case 0xc:
    if (code) {
      pcVar1 = "u";
    }
    else {
      pcVar1 = "Trivial upper";
    }
    break;
  case 0xd:
    if (code) {
      pcVar1 = "p";
    }
    else {
      pcVar1 = "Trivial point";
    }
    break;
  case 0xe:
    if (code) {
      pcVar1 = "X";
    }
    else {
      pcVar1 = "User solution";
    }
    break;
  case 0xf:
    if (!code) {
      pcVar1 = "";
      break;
    }
LAB_002bfc43:
    pcVar1 = " ";
    break;
  case -1:
    if (!code) goto LAB_002bfd42;
    goto LAB_002bfc43;
  default:
    printf("HighsMipSolverData::solutionSourceToString: Unknown source = %d\n",
           (ulong)(uint)solution_source);
    if (code) {
      pcVar1 = "*";
      break;
    }
LAB_002bfd42:
    pcVar1 = "None";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_11);
  return __return_storage_ptr__;
}

Assistant:

std::string HighsMipSolverData::solutionSourceToString(
    const int solution_source, const bool code) {
  if (solution_source == kSolutionSourceNone) {
    if (code) return " ";
    return "None";
  } else if (solution_source == kSolutionSourceBranching) {
    if (code) return "B";
    return "Branching";
  } else if (solution_source == kSolutionSourceCentralRounding) {
    if (code) return "C";
    return "Central rounding";
  } else if (solution_source == kSolutionSourceFeasibilityPump) {
    if (code) return "F";
    return "Feasibility pump";
  } else if (solution_source == kSolutionSourceHeuristic) {
    if (code) return "H";
    return "Heuristic";
    //  } else if (solution_source == kSolutionSourceInitial) {
    //    if (code) return "I";
    //    return "Initial";
  } else if (solution_source == kSolutionSourceSubMip) {
    if (code) return "L";
    return "Sub-MIP";
  } else if (solution_source == kSolutionSourceEmptyMip) {
    if (code) return "P";
    return "Empty MIP";
  } else if (solution_source == kSolutionSourceRandomizedRounding) {
    if (code) return "R";
    return "Randomized rounding";
  } else if (solution_source == kSolutionSourceSolveLp) {
    if (code) return "S";
    return "Solve LP";
  } else if (solution_source == kSolutionSourceEvaluateNode) {
    if (code) return "T";
    return "Evaluate node";
  } else if (solution_source == kSolutionSourceUnbounded) {
    if (code) return "U";
    return "Unbounded";
  } else if (solution_source == kSolutionSourceTrivialZ) {
    if (code) return "z";
    return "Trivial zero";
  } else if (solution_source == kSolutionSourceTrivialL) {
    if (code) return "l";
    return "Trivial lower";
  } else if (solution_source == kSolutionSourceTrivialU) {
    if (code) return "u";
    return "Trivial upper";
  } else if (solution_source == kSolutionSourceTrivialP) {
    if (code) return "p";
    return "Trivial point";
  } else if (solution_source == kSolutionSourceUserSolution) {
    if (code) return "X";
    return "User solution";
  } else if (solution_source == kSolutionSourceCleanup) {
    if (code) return " ";
    return "";
  } else {
    printf("HighsMipSolverData::solutionSourceToString: Unknown source = %d\n",
           solution_source);
    assert(0 == 111);
    if (code) return "*";
    return "None";
  }
}